

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::ShiftRightU_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  uint32 uVar1;
  uint32 uVar2;
  Var pvVar3;
  uint32 nResult;
  uint32 nShift;
  uint32 nValue;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  uVar1 = JavascriptConversion::ToUInt32(aLeft,scriptContext);
  uVar2 = JavascriptConversion::ToUInt32(aRight,scriptContext);
  pvVar3 = JavascriptNumber::ToVar(uVar1 >> ((byte)uVar2 & 0x1f),scriptContext);
  return pvVar3;
}

Assistant:

Var JavascriptMath::ShiftRightU_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_ShiftRightU_Full);
            uint32 nValue   = JavascriptConversion::ToUInt32(aLeft, scriptContext);
            uint32 nShift   = JavascriptConversion::ToUInt32(aRight, scriptContext);

            uint32 nResult  = nValue >> (nShift & 0x1F);

            return JavascriptNumber::ToVar(nResult,scriptContext);
            JIT_HELPER_END(Op_ShiftRightU_Full);
        }